

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenTablePost(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  IDLOptionsCpp *opts;
  int iVar1;
  BaseType BVar2;
  Namespace *this_01;
  pointer ppFVar3;
  CppGenerator *pCVar4;
  IDLOptions *opts_00;
  Value *pVVar5;
  FieldDef *union_field;
  char *__rhs;
  FieldDef *pFVar6;
  pointer ppFVar7;
  string *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  StructDef *pSVar8;
  string qualified_create_name;
  string local_4e8;
  string local_4c8;
  CppGenerator *local_4a8;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  StructDef *local_460;
  IDLOptions *local_458;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    GenNativeTablePost(this,struct_def);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"STRUCT_NAME",(allocator<char> *)&local_4a0);
  EscapeKeyword(&local_4c8,this,(string *)struct_def);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_4e8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"NATIVE_NAME",(allocator<char> *)&local_480);
  EscapeKeyword(&local_4a0,this,(string *)struct_def);
  opts = &this->opts_;
  NativeName(&local_4c8,&local_4a0,struct_def,&opts->super_IDLOptions);
  CodeWriter::SetValue(this_00,&local_4e8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4e8);
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    GenCopyCtorAssignOpDefs(this,struct_def);
    TableUnPackSignature_abi_cxx11_(&local_4c8,this,struct_def,false,&opts->super_IDLOptions);
    std::operator+(&local_4e8,"inline ",&local_4c8);
    std::operator+(&local_f0,&local_4e8," {");
    CodeWriter::operator+=(this_00,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4c8);
    iVar1 = *(int *)&(this->opts_).super_IDLOptions.field_0x30c;
    if (iVar1 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "  auto _o = std::unique_ptr<{{NATIVE_NAME}}>(new {{NATIVE_NAME}}());",
                 (allocator<char> *)&local_4e8);
      CodeWriter::operator+=(this_00,&local_130);
      this_02 = &local_130;
    }
    else if (iVar1 == 0) {
      WrapNativeNameInNameSpace_abi_cxx11_
                (&local_4e8,this,struct_def,&((this->super_BaseGenerator).parser_)->opts);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c8,"POINTER_TYPE",(allocator<char> *)&local_480);
      GenTypeNativePtr(&local_4a0,this,&local_4e8,(FieldDef *)0x0,false);
      CodeWriter::SetValue(this_00,&local_4c8,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,
                 "  {{POINTER_TYPE}} _o = {{POINTER_TYPE}}(new {{NATIVE_NAME}}());",
                 (allocator<char> *)&local_4c8);
      CodeWriter::operator+=(this_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      this_02 = &local_4e8;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"  auto _o = std::make_unique<{{NATIVE_NAME}}>();",
                 (allocator<char> *)&local_4e8);
      CodeWriter::operator+=(this_00,&local_150);
      this_02 = &local_150;
    }
    std::__cxx11::string::~string((string *)this_02);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"  UnPackTo(_o.get(), _resolver);",(allocator<char> *)&local_4e8
              );
    CodeWriter::operator+=(this_00,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"  return _o.release();",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"}",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    TableUnPackToSignature_abi_cxx11_(&local_4c8,this,struct_def,false,&opts->super_IDLOptions);
    std::operator+(&local_4e8,"inline ",&local_4c8);
    std::operator+(&local_1f0,&local_4e8," {");
    CodeWriter::operator+=(this_00,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"  (void)_o;",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"  (void)_resolver;",(allocator<char> *)&local_4e8);
    local_4a8 = this;
    local_458 = &opts->super_IDLOptions;
    CodeWriter::operator+=(this_00,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    local_460 = struct_def;
    for (ppFVar7 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pSVar8 = local_460, pCVar4 = local_4a8
        , ppFVar7 !=
          (local_460->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppFVar7 = ppFVar7 + 1) {
      pFVar6 = *ppFVar7;
      if (pFVar6->deprecated == false) {
        if ((pFVar6->value).type.base_type == BASE_TYPE_UTYPE) {
          union_field = ppFVar7[1];
        }
        else {
          union_field = (FieldDef *)0x0;
        }
        GenUnpackFieldStatement_abi_cxx11_(&local_4e8,local_4a8,pFVar6,union_field);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4c8,"FIELD_NAME",(allocator<char> *)&local_480);
        Name_abi_cxx11_(&local_4a0,pCVar4,pFVar6);
        CodeWriter::SetValue(this_00,&local_4c8,&local_4a0);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4c8);
        BVar2 = (pFVar6->value).type.base_type;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_480,"  { auto _e = {{FIELD_NAME}}(); ",
                   (allocator<char> *)&local_450);
        __rhs = "if (_e) ";
        if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
          __rhs = "";
        }
        std::operator+(&local_4a0,&local_480,__rhs);
        std::operator+(&local_4c8,&local_4a0,&local_4e8);
        std::operator+(&local_50,&local_4c8," }");
        CodeWriter::operator+=(this_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_4e8);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"}",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_250);
    opts_00 = local_458;
    pCVar4 = local_4a8;
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    TablePackSignature_abi_cxx11_(&local_4c8,pCVar4,pSVar8,false,opts_00);
    std::operator+(&local_4e8,"inline ",&local_4c8);
    std::operator+(&local_290,&local_4e8," {");
    CodeWriter::operator+=(this_00,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"  return Create{{STRUCT_NAME}}(_fbb, _o, _rehasher);",
               (allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"}",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    TableCreateSignature_abi_cxx11_(&local_4c8,pCVar4,pSVar8,false,opts_00);
    std::operator+(&local_4e8,"inline ",&local_4c8);
    std::operator+(&local_310,&local_4e8," {");
    CodeWriter::operator+=(this_00,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"  (void)_rehasher;",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"  (void)_o;",(allocator<char> *)&local_4e8);
    CodeWriter::operator+=(this_00,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    GetBuilder_abi_cxx11_(&local_480,pCVar4);
    std::operator+(&local_4a0,"  struct _VectorArgs { ",&local_480);
    std::operator+(&local_4c8,&local_4a0," *__fbb; const ");
    EscapeKeyword(&local_390,pCVar4,(string *)pSVar8);
    NativeName(&local_450,&local_390,pSVar8,opts_00);
    std::operator+(&local_4e8,&local_4c8,&local_450);
    std::operator+(&local_370,&local_4e8,
                   "* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;"
                  );
    CodeWriter::operator+=(this_00,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_480);
    ppFVar7 = (pSVar8->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (; ppFVar7 !=
           (pSVar8->fields).vec.
           super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
           _M_impl.super__Vector_impl_data._M_finish; ppFVar7 = ppFVar7 + 1) {
      pFVar6 = *ppFVar7;
      if (pFVar6->deprecated == false) {
        BVar2 = (pFVar6->value).type.base_type;
        if ((BVar2 == BASE_TYPE_VECTOR64) || (BVar2 == BASE_TYPE_VECTOR)) {
          Name_abi_cxx11_(&local_480,local_4a8,pFVar6);
          std::operator+(&local_4a0,"_o->",&local_480);
          std::operator+(&local_4c8,&local_4a0,".size()");
          GenVectorForceAlign(&local_4e8,local_4a8,pFVar6,&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::__cxx11::string::~string((string *)&local_480);
          if (local_4e8._M_string_length != 0) {
            std::operator+(&local_70,"  ",&local_4e8);
            CodeWriter::operator+=(this_00,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
          }
          std::__cxx11::string::~string((string *)&local_4e8);
        }
        Name_abi_cxx11_(&local_480,local_4a8,pFVar6);
        std::operator+(&local_4a0,"  auto _",&local_480);
        std::operator+(&local_4c8,&local_4a0," = ");
        GenCreateParam_abi_cxx11_(&local_450,local_4a8,pFVar6);
        std::operator+(&local_4e8,&local_4c8,&local_450);
        std::operator+(&local_90,&local_4e8,";");
        CodeWriter::operator+=(this_00,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_480);
      }
      pSVar8 = local_460;
    }
    this_01 = (pSVar8->super_Definition).defined_namespace;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,"Create",(allocator<char> *)&local_4a0);
    Namespace::GetFullyQualifiedName(&local_4e8,this_01,&local_4c8,1000);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,"CREATE_NAME",(allocator<char> *)&local_480);
    TranslateNameSpace(&local_4a0,&local_4e8);
    CodeWriter::SetValue(this_00,&local_4c8,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"  return {{CREATE_NAME}}{{STRUCT_NAME}}(",
               (allocator<char> *)&local_4c8);
    CodeWriter::operator+=(this_00,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"      _fbb\\",(allocator<char> *)&local_4c8);
    CodeWriter::operator+=(this_00,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    ppFVar3 = (pSVar8->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar7 = (pSVar8->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar7 != ppFVar3;
        ppFVar7 = ppFVar7 + 1) {
      pFVar6 = *ppFVar7;
      if (pFVar6->deprecated == false) {
        if (((pFVar6->value).type.base_type == BASE_TYPE_STRUCT) &&
           (pSVar8 = (pFVar6->value).type.struct_def, pSVar8->fixed == true)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4c8,"native_type",(allocator<char> *)&local_4a0);
          pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                             (&(pSVar8->super_Definition).attributes,&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          pFVar6 = *ppFVar7;
          if (pVVar5 == (Value *)0x0) goto LAB_00156f7f;
          Name_abi_cxx11_(&local_4a0,local_4a8,pFVar6);
          std::operator+(&local_4c8,",\n      &_",&local_4a0);
          std::operator+(&local_b0,&local_4c8,"\\");
          CodeWriter::operator+=(this_00,&local_b0);
          __return_storage_ptr__ = &local_b0;
        }
        else {
LAB_00156f7f:
          Name_abi_cxx11_(&local_4a0,local_4a8,pFVar6);
          std::operator+(&local_4c8,",\n      _",&local_4a0);
          __return_storage_ptr__ = &local_d0;
          std::operator+(__return_storage_ptr__,&local_4c8,"\\");
          CodeWriter::operator+=(this_00,__return_storage_ptr__);
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4a0);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,");",(allocator<char> *)&local_4c8);
    CodeWriter::operator+=(this_00,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"}",(allocator<char> *)&local_4c8);
    CodeWriter::operator+=(this_00,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"",(allocator<char> *)&local_4c8);
    CodeWriter::operator+=(this_00,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_4e8);
  }
  return;
}

Assistant:

void GenTablePost(const StructDef &struct_def) {
    if (opts_.generate_object_based_api) { GenNativeTablePost(struct_def); }

    code_.SetValue("STRUCT_NAME", Name(struct_def));
    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));

    if (opts_.generate_object_based_api) {
      // Generate the >= C++11 copy ctor and assignment operator definitions.
      GenCopyCtorAssignOpDefs(struct_def);

      // Generate the X::UnPack() method.
      code_ +=
          "inline " + TableUnPackSignature(struct_def, false, opts_) + " {";

      if (opts_.g_cpp_std == cpp::CPP_STD_X0) {
        auto native_name = WrapNativeNameInNameSpace(struct_def, parser_.opts);
        code_.SetValue("POINTER_TYPE",
                       GenTypeNativePtr(native_name, nullptr, false));
        code_ +=
            "  {{POINTER_TYPE}} _o = {{POINTER_TYPE}}(new {{NATIVE_NAME}}());";
      } else if (opts_.g_cpp_std == cpp::CPP_STD_11) {
        code_ +=
            "  auto _o = std::unique_ptr<{{NATIVE_NAME}}>(new "
            "{{NATIVE_NAME}}());";
      } else {
        code_ += "  auto _o = std::make_unique<{{NATIVE_NAME}}>();";
      }
      code_ += "  UnPackTo(_o.get(), _resolver);";
      code_ += "  return _o.release();";
      code_ += "}";
      code_ += "";
      code_ +=
          "inline " + TableUnPackToSignature(struct_def, false, opts_) + " {";
      code_ += "  (void)_o;";
      code_ += "  (void)_resolver;";

      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        const auto &field = **it;
        if (field.deprecated) { continue; }

        // Assign a value from |this| to |_o|.   Values from |this| are stored
        // in a variable |_e| by calling this->field_type().  The value is then
        // assigned to |_o| using the GenUnpackFieldStatement.
        const bool is_union = field.value.type.base_type == BASE_TYPE_UTYPE;
        const auto statement =
            GenUnpackFieldStatement(field, is_union ? *(it + 1) : nullptr);

        code_.SetValue("FIELD_NAME", Name(field));
        auto prefix = "  { auto _e = {{FIELD_NAME}}(); ";
        auto check = IsScalar(field.value.type.base_type) ? "" : "if (_e) ";
        auto postfix = " }";
        code_ += std::string(prefix) + check + statement + postfix;
      }
      code_ += "}";
      code_ += "";

      // Generate the X::Pack member function that simply calls the global
      // CreateX function.
      code_ += "inline " + TablePackSignature(struct_def, false, opts_) + " {";
      code_ += "  return Create{{STRUCT_NAME}}(_fbb, _o, _rehasher);";
      code_ += "}";
      code_ += "";

      // Generate a CreateX method that works with an unpacked C++ object.
      code_ +=
          "inline " + TableCreateSignature(struct_def, false, opts_) + " {";
      code_ += "  (void)_rehasher;";
      code_ += "  (void)_o;";

      code_ +=
          "  struct _VectorArgs "
          "{ " +
          GetBuilder() +
          " *__fbb; "
          "const " +
          NativeName(Name(struct_def), &struct_def, opts_) +
          "* __o; "
          "const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { "
          "&_fbb, _o, _rehasher}; (void)_va;";

      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) { continue; }
        if (IsVector(field.value.type)) {
          const std::string force_align_code =
              GenVectorForceAlign(field, "_o->" + Name(field) + ".size()");
          if (!force_align_code.empty()) { code_ += "  " + force_align_code; }
        }
        code_ += "  auto _" + Name(field) + " = " + GenCreateParam(field) + ";";
      }
      // Need to call "Create" with the struct namespace.
      const auto qualified_create_name =
          struct_def.defined_namespace->GetFullyQualifiedName("Create");
      code_.SetValue("CREATE_NAME", TranslateNameSpace(qualified_create_name));

      code_ += "  return {{CREATE_NAME}}{{STRUCT_NAME}}(";
      code_ += "      _fbb\\";
      for (const auto &field : struct_def.fields.vec) {
        if (field->deprecated) { continue; }

        bool pass_by_address = false;
        if (field->value.type.base_type == BASE_TYPE_STRUCT) {
          if (IsStruct(field->value.type)) {
            auto native_type =
                field->value.type.struct_def->attributes.Lookup("native_type");
            if (native_type) { pass_by_address = true; }
          }
        }

        // Call the CreateX function using values from |_o|.
        if (pass_by_address) {
          code_ += ",\n      &_" + Name(*field) + "\\";
        } else {
          code_ += ",\n      _" + Name(*field) + "\\";
        }
      }
      code_ += ");";
      code_ += "}";
      code_ += "";
    }
  }